

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

void duckdb::BitStringFunction<false>(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  long lVar4;
  int *piVar5;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat *pUVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  VectorType VVar15;
  ValidityMask *in_R8;
  idx_t in_R9;
  long lVar16;
  UnifiedVectorFormat *pUVar17;
  bool bVar18;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  anon_struct_16_3_d7536bce_for_pointer aVar19;
  string_t sVar20;
  UnifiedVectorFormat *local_d8;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar15 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar15);
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar19 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          **(int **)(vector_00 + 0x20),in_R8,in_R9);
      paVar3->pointer = aVar19;
      return;
    }
  }
  else {
    local_d8 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      piVar5 = *(int **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar15);
        lVar16 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          lVar12 = 8;
          while (bVar18 = local_d8 != (UnifiedVectorFormat *)0x0, local_d8 = local_d8 + -1, bVar18)
          {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar12);
            left_02.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar12);
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,*piVar5,in_R8,in_R9);
            *(long *)(lVar16 + -8 + lVar12) = sVar20.value._0_8_;
            *(long *)(lVar16 + lVar12) = sVar20.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
          return;
        }
        uVar8 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(local_d8 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar17 + 0x40;
            if (local_d8 <= pUVar17 + 0x40) {
              pUVar6 = local_d8;
            }
LAB_0067daab:
            uVar9 = (long)pUVar17 << 4 | 8;
            for (; pUVar7 = pUVar17, pUVar17 < pUVar6; pUVar17 = pUVar17 + 1) {
              left.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
              left.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left,*piVar5,in_R8,in_R9);
              *(long *)(lVar16 + -8 + uVar9) = sVar20.value._0_8_;
              *(long *)(lVar16 + uVar9) = sVar20.value._8_8_;
              uVar9 = uVar9 + 0x10;
            }
          }
          else {
            uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar17 + 0x40;
            if (local_d8 <= pUVar17 + 0x40) {
              pUVar6 = local_d8;
            }
            if (uVar9 == 0xffffffffffffffff) goto LAB_0067daab;
            pUVar7 = pUVar6;
            if (uVar9 != 0) {
              uVar14 = (long)pUVar17 << 4 | 8;
              for (uVar10 = 0; pUVar7 = pUVar17 + uVar10, pUVar17 + uVar10 < pUVar6;
                  uVar10 = uVar10 + 1) {
                if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar14);
                  left_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar14);
                  sVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,*piVar5,in_R8,in_R9);
                  *(long *)(lVar16 + -8 + uVar14) = sVar20.value._0_8_;
                  *(long *)(lVar16 + uVar14) = sVar20.value._8_8_;
                }
                uVar14 = uVar14 + 0x10;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar17 = pUVar7;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar16 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar15);
          lVar12 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar13 = 0;
            while (bVar18 = local_d8 != (UnifiedVectorFormat *)0x0, local_d8 = local_d8 + -1, bVar18
                  ) {
              sVar20.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + 8 + lVar13 * 4);
              sVar20.value._0_8_ = *(undefined8 *)(lVar4 + lVar13 * 4);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar20,*(int *)(lVar16 + lVar13),
                                  in_R8,in_R9);
              *(long *)(lVar12 + lVar13 * 4) = sVar20.value._0_8_;
              *(long *)(lVar12 + 8 + lVar13 * 4) = sVar20.value._8_8_;
              lVar13 = lVar13 + 4;
            }
          }
          else {
            pUVar17 = (UnifiedVectorFormat *)0x0;
            for (uVar8 = 0; uVar8 != (ulong)(local_d8 + 0x3f) >> 6; uVar8 = uVar8 + 1) {
              lVar13 = *(long *)(result + 0x28);
              if (lVar13 == 0) {
                pUVar6 = pUVar17 + 0x40;
                if (local_d8 <= pUVar17 + 0x40) {
                  pUVar6 = local_d8;
                }
LAB_0067df23:
                uVar9 = (long)pUVar17 << 4 | 8;
                for (; pUVar7 = pUVar17, pUVar17 < pUVar6; pUVar17 = pUVar17 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
                  left_03.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
                  sVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,
                                      *(int *)(lVar16 + (long)pUVar17 * 4),in_R8,in_R9);
                  *(long *)(lVar12 + -8 + uVar9) = sVar20.value._0_8_;
                  *(long *)(lVar12 + uVar9) = sVar20.value._8_8_;
                  uVar9 = uVar9 + 0x10;
                }
              }
              else {
                uVar9 = *(ulong *)(lVar13 + uVar8 * 8);
                pUVar6 = pUVar17 + 0x40;
                if (local_d8 <= pUVar17 + 0x40) {
                  pUVar6 = local_d8;
                }
                if (uVar9 == 0xffffffffffffffff) goto LAB_0067df23;
                pUVar7 = pUVar6;
                if (uVar9 != 0) {
                  uVar10 = (long)pUVar17 << 4 | 8;
                  for (uVar14 = 0; pUVar7 = pUVar17 + uVar14, pUVar17 + uVar14 < pUVar6;
                      uVar14 = uVar14 + 1) {
                    if ((uVar9 >> (uVar14 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar10);
                      left_04.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar10);
                      sVar20 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,
                                          *(int *)(lVar16 + (long)pUVar17 * 4 + uVar14 * 4),in_R8,
                                          in_R9);
                      *(long *)(lVar12 + -8 + uVar10) = sVar20.value._0_8_;
                      *(long *)(lVar12 + uVar10) = sVar20.value._8_8_;
                    }
                    uVar10 = uVar10 + 0x10;
                  }
                }
              }
              pUVar17 = pUVar7;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_d8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,local_d8);
          duckdb::Vector::SetVectorType(VVar15);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            puVar11 = (undefined8 *)(lVar4 + 8);
            for (pUVar17 = (UnifiedVectorFormat *)0x0; local_d8 != pUVar17; pUVar17 = pUVar17 + 1) {
              pUVar6 = pUVar17;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar17 * 4);
              }
              pUVar7 = pUVar17;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar17 * 4);
              }
              left_01.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
              left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,
                                  *(int *)(local_b8 + (long)pUVar7 * 4),in_R8,in_R9);
              puVar11[-1] = sVar20.value._0_8_;
              *puVar11 = sVar20.value._8_8_;
              puVar11 = puVar11 + 2;
            }
          }
          else {
            puVar11 = (undefined8 *)(lVar4 + 8);
            for (pUVar17 = (UnifiedVectorFormat *)0x0; local_d8 != pUVar17; pUVar17 = pUVar17 + 1) {
              pUVar6 = pUVar17;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar17 * 4);
              }
              pUVar7 = pUVar17;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar17 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar6 >> 6) * 8) >> ((ulong)pUVar6 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(int *)(local_b8 + (long)pUVar7 * 4),in_R8,in_R9);
                puVar11[-1] = sVar20.value._0_8_;
                *puVar11 = sVar20.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar17);
              }
              puVar11 = puVar11 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar15);
        lVar16 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar11 = (undefined8 *)(lVar16 + 8);
          for (pUVar17 = (UnifiedVectorFormat *)0x0; local_d8 != pUVar17; pUVar17 = pUVar17 + 1) {
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                *(int *)(lVar4 + (long)pUVar17 * 4),in_R8,in_R9);
            puVar11[-1] = sVar20.value._0_8_;
            *puVar11 = sVar20.value._8_8_;
            puVar11 = puVar11 + 2;
          }
          return;
        }
        lVar16 = lVar16 + 8;
        uVar8 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(local_d8 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar17 + 0x40;
            if (local_d8 <= pUVar17 + 0x40) {
              pUVar6 = local_d8;
            }
LAB_0067dd59:
            puVar11 = (undefined8 *)((long)pUVar17 * 0x10 + lVar16);
            for (; pUVar7 = pUVar17, pUVar17 < pUVar6; pUVar17 = pUVar17 + 1) {
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                  *(int *)(lVar4 + (long)pUVar17 * 4),in_R8,in_R9);
              puVar11[-1] = sVar20.value._0_8_;
              *puVar11 = sVar20.value._8_8_;
              puVar11 = puVar11 + 2;
            }
          }
          else {
            uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar17 + 0x40;
            if (local_d8 <= pUVar17 + 0x40) {
              pUVar6 = local_d8;
            }
            if (uVar9 == 0xffffffffffffffff) goto LAB_0067dd59;
            pUVar7 = pUVar6;
            if (uVar9 != 0) {
              puVar11 = (undefined8 *)((long)pUVar17 * 0x10 + lVar16);
              for (uVar10 = 0; pUVar7 = pUVar17 + uVar10, pUVar17 + uVar10 < pUVar6;
                  uVar10 = uVar10 + 1) {
                if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
                  sVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                      *(int *)(lVar4 + (long)pUVar17 * 4 + uVar10 * 4),in_R8,in_R9);
                  puVar11[-1] = sVar20.value._0_8_;
                  *puVar11 = sVar20.value._8_8_;
                }
                puVar11 = puVar11 + 2;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar17 = pUVar7;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar15);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitStringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, int32_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t input, int32_t n) {
		    if (n < 0) {
			    throw InvalidInputException("The bitstring length cannot be negative");
		    }
		    idx_t input_length;
		    if (FROM_STRING) {
			    input_length = input.GetSize();
		    } else {
			    input_length = Bit::BitLength(input);
		    }
		    if (idx_t(n) < input_length) {
			    throw InvalidInputException("Length must be equal or larger than input string");
		    }
		    idx_t len;
		    if (FROM_STRING) {
			    Bit::TryGetBitStringSize(input, len, nullptr); // string verification
		    }

		    len = Bit::ComputeBitstringLen(UnsafeNumericCast<idx_t>(n));
		    string_t target = StringVector::EmptyString(result, len);
		    if (FROM_STRING) {
			    Bit::BitString(input, UnsafeNumericCast<idx_t>(n), target);
		    } else {
			    Bit::ExtendBitString(input, UnsafeNumericCast<idx_t>(n), target);
		    }
		    target.Finalize();
		    return target;
	    });
}